

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# electron_optimisation_algorithm.cpp
# Opt level: O0

void __thiscall
indigox::algorithm::ElectronOptimisationAlgorithm::PopulateMVP2EV
          (ElectronOptimisationAlgorithm *this)

{
  bool bVar1;
  pair<void_*,_void_*> *__args;
  ElnVertProp *pEVar2;
  map<std::pair<void_*,_void_*>,_void_*,_std::less<std::pair<void_*,_void_*>_>,_std::allocator<std::pair<const_std::pair<void_*,_void_*>,_void_*>_>_>
  *in_RDI;
  MolVertPair id;
  ElnVertProp *prop;
  ElnVertexIter v;
  ElnVertIterPair vs;
  VertType in_stack_ffffffffffffff98;
  Graph<indigox::ElnVertProp,_indigox::utils::NoProperty,_indigox::utils::UndirectedGraph>
  *in_stack_ffffffffffffffa0;
  _Self local_20;
  VertIterPair local_18;
  
  std::
  map<std::pair<void_*,_void_*>,_void_*,_std::less<std::pair<void_*,_void_*>_>,_std::allocator<std::pair<const_std::pair<void_*,_void_*>,_void_*>_>_>
  ::clear((map<std::pair<void_*,_void_*>,_void_*,_std::less<std::pair<void_*,_void_*>_>,_std::allocator<std::pair<const_std::pair<void_*,_void_*>,_void_*>_>_>
           *)0x15456c);
  std::__shared_ptr_access<indigox::ElectronGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<indigox::ElectronGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x15457e);
  local_18 = utils::
             Graph<indigox::ElnVertProp,_indigox::utils::NoProperty,_indigox::utils::UndirectedGraph>
             ::GetVertices((Graph<indigox::ElnVertProp,_indigox::utils::NoProperty,_indigox::utils::UndirectedGraph>
                            *)0x154586);
  local_20._M_node = local_18.first._M_node;
  while( true ) {
    bVar1 = std::operator!=(&local_20,&local_18.second);
    if (!bVar1) break;
    __args = (pair<void_*,_void_*> *)
             std::
             __shared_ptr_access<indigox::ElectronGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<indigox::ElectronGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1545c8);
    std::_List_iterator<void_*>::operator*((_List_iterator<void_*> *)in_stack_ffffffffffffffa0);
    pEVar2 = utils::
             Graph<indigox::ElnVertProp,_indigox::utils::NoProperty,_indigox::utils::UndirectedGraph>
             ::GetProperties(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    if ((pEVar2->id).first == (pEVar2->id).second) {
      pEVar2->electron_count = '\0';
    }
    else {
      pEVar2->electron_count = '\0';
    }
    in_stack_ffffffffffffffa0 =
         (Graph<indigox::ElnVertProp,_indigox::utils::NoProperty,_indigox::utils::UndirectedGraph> *
         )&(in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
    std::_List_iterator<void_*>::operator*((_List_iterator<void_*> *)in_stack_ffffffffffffffa0);
    std::
    map<std::pair<void*,void*>,void*,std::less<std::pair<void*,void*>>,std::allocator<std::pair<std::pair<void*,void*>const,void*>>>
    ::emplace<std::pair<void*,void*>&,void*&>(in_RDI,__args,(void **)in_stack_ffffffffffffffa0);
    std::_List_iterator<void_*>::operator++(&local_20);
  }
  return;
}

Assistant:

void ElectronOptimisationAlgorithm::PopulateMVP2EV() {
  mvp2ev_.clear();
  ElnVertIterPair vs = parent_->elnGraph_->GetVertices();
  for (ElnVertexIter v = vs.first; v != vs.second; ++v) {
    ElnVertProp* prop = parent_->elnGraph_->GetProperties(*v);
    MolVertPair id = prop->id;
    if (id.first == id.second)
      prop->electron_count = 0;
    else
      // Preplace code
      //prop->electron_count = 2;
      prop->electron_count = 0;
      // End Preplace code
    mvp2ev_.emplace(id, *v);
  }
}